

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O2

void __thiscall CSHA1::ReportHash(CSHA1 *this,char *szReport,uchar uReportType)

{
  long lVar1;
  char szTemp [16];
  
  if (szReport != (char *)0x0) {
    if (uReportType == '\x01') {
      sprintf(szTemp,"%u",(ulong)this->m_digest[0]);
      strcat(szReport,szTemp);
      for (lVar1 = -0x13; lVar1 != 0; lVar1 = lVar1 + 1) {
        sprintf(szTemp," %u",(ulong)*(byte *)((long)this->__reserved2 + lVar1));
        strcat(szReport,szTemp);
      }
    }
    else if (uReportType == '\0') {
      sprintf(szTemp,"%02X",(ulong)this->m_digest[0]);
      strcat(szReport,szTemp);
      for (lVar1 = -0x13; lVar1 != 0; lVar1 = lVar1 + 1) {
        sprintf(szTemp," %02X",(ulong)*(byte *)((long)this->__reserved2 + lVar1));
        strcat(szReport,szTemp);
      }
    }
    else {
      builtin_strncpy(szReport,"Error: Unknown report type!",0x1c);
    }
  }
  return;
}

Assistant:

void CSHA1::ReportHash(char *szReport, unsigned char uReportType)
{
	unsigned char i;
	char szTemp[16];

	if(szReport == NULL) return;

	if(uReportType == REPORT_HEX)
	{
		sprintf(szTemp, "%02X", m_digest[0]);
		strcat(szReport, szTemp);

		for(i = 1; i < 20; i++)
		{
			sprintf(szTemp, " %02X", m_digest[i]);
			strcat(szReport, szTemp);
		}
	}
	else if(uReportType == REPORT_DIGIT)
	{
		sprintf(szTemp, "%u", m_digest[0]);
		strcat(szReport, szTemp);

		for(i = 1; i < 20; i++)
		{
			sprintf(szTemp, " %u", m_digest[i]);
			strcat(szReport, szTemp);
		}
	}
	else strcpy(szReport, "Error: Unknown report type!");
}